

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O0

void Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
               (ImageTemplate<unsigned_char> *image1,uint32_t startX1,uint32_t startY1,
               ImageTemplate<unsigned_char> *image2,uint32_t startX2,uint32_t startY2,uint32_t width
               ,uint32_t height)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RDI);
  if (((((((!bVar1) && (bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RCX), !bVar1)
          ) && (bVar1 = IsCorrectColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                                  ((ImageTemplate<unsigned_char> *)
                                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
               bVar1)) &&
        ((bVar1 = IsCorrectColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                            ((ImageTemplate<unsigned_char> *)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)), bVar1
         && (in_stack_00000008 != 0)))) &&
       ((in_stack_00000010 != 0 &&
        ((uVar2 = in_ESI + in_stack_00000008,
         uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI), uVar2 <= uVar3 &&
         (uVar2 = in_EDX + in_stack_00000010,
         uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI), uVar2 <= uVar3))))))
      && (in_stack_00000008 <= in_ESI + in_stack_00000008)) &&
     ((in_stack_00000010 <= in_EDX + in_stack_00000010 &&
      (uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RCX),
      in_R8D + in_stack_00000008 <= uVar3)))) {
    uVar2 = in_R9D + in_stack_00000010;
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RCX);
    if ((uVar2 <= uVar3) &&
       ((in_stack_00000008 <= in_R8D + in_stack_00000008 &&
        (in_stack_00000010 <= in_R9D + in_stack_00000010)))) {
      return;
    }
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException((imageException *)CONCAT44(in_ESI,in_EDX),(char *)in_RCX);
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ParameterValidation( const TImage & image1, uint32_t startX1, uint32_t startY1,
                              const TImage & image2, uint32_t startX2, uint32_t startY2,
                              uint32_t width, uint32_t height )
    {
        if( image1.empty() || image2.empty() || !IsCorrectColorCount( image1 ) || !IsCorrectColorCount( image2 ) || width == 0 || height == 0 ||
            startX1 + width > image1.width() || startY1 + height > image1.height() || startX1 + width < width || startY1 + height < height ||
            startX2 + width > image2.width() || startY2 + height > image2.height() || startX2 + width < width || startY2 + height < height )
            throw imageException( "Bad input parameters in image function" );
    }